

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O3

void __thiscall QDateTime::setSecsSinceEpoch(QDateTime *this,qint64 secs)

{
  undefined8 uVar1;
  QDateTimePrivate *pQVar2;
  QDateTimePrivate *pQVar3;
  
  if (SEXT816(secs * 1000) == SEXT816(secs) * SEXT416(1000)) {
    setMSecsSinceEpoch(this,secs * 1000);
    return;
  }
  pQVar3 = (this->d).d;
  if (((ulong)pQVar3 & 1) == 0) {
    if ((__int_type_conflict)
        (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> != 1) {
      pQVar2 = (QDateTimePrivate *)operator_new(0x20);
      (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i = 0;
      uVar1 = *(undefined8 *)((long)&pQVar3->m_msecs + 4);
      *(undefined8 *)&pQVar2->m_status = *(undefined8 *)&pQVar3->m_status;
      *(undefined8 *)((long)&pQVar2->m_msecs + 4) = uVar1;
      QTimeZone::QTimeZone(&pQVar2->m_timeZone,&pQVar3->m_timeZone);
      (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i = 1;
      pQVar3 = (this->d).d;
      LOCK();
      (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type_conflict)
            (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value.super___atomic_base<int> + -1);
      UNLOCK();
      if ((__int_type_conflict)
          (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> == 0) {
        pQVar3 = (this->d).d;
        if (pQVar3 != (QDateTimePrivate *)0x0) {
          QTimeZone::~QTimeZone(&pQVar3->m_timeZone);
        }
        operator_delete(pQVar3,0x20);
      }
      (this->d).d = pQVar2;
      pQVar3 = pQVar2;
    }
    *(byte *)&(pQVar3->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
              super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i =
         (byte)(pQVar3->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
               super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i & 0xf1;
  }
  else {
    (this->d).d = (QDateTimePrivate *)((ulong)pQVar3 & 0xfffffffffffffff1);
  }
  return;
}

Assistant:

void QDateTime::setSecsSinceEpoch(qint64 secs)
{
    qint64 msecs;
    if (!qMulOverflow(secs, std::integral_constant<qint64, MSECS_PER_SEC>(), &msecs))
        setMSecsSinceEpoch(msecs);
    else
        d.invalidate();
}